

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

Value * __thiscall
GlobOptBlockData::FindFuturePropertyValue(GlobOptBlockData *this,PropertySym *propertySym)

{
  OpCode OVar1;
  Instr *pIVar2;
  Opnd *this_00;
  Func *pFVar3;
  ScriptContext *scriptContext;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar7;
  Value *pVVar8;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  StackSym *pSVar9;
  PropertySym *pPVar10;
  RegOpnd *pRVar11;
  SymOpnd *pSVar12;
  
  pPVar10 = propertySym;
  if (propertySym == (PropertySym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x54a,"(propertySym)","propertySym");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
    pPVar10 = (PropertySym *)0x0;
  }
  pVVar8 = FindValue(this,&pPVar10->super_Sym);
  if (pVVar8 != (Value *)0x0) {
    return pVVar8;
  }
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->globOpt->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_01);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(this->globOpt->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,CopyPropPhase,sourceContextId,functionId);
  if (bVar5) {
    return (Value *)0x0;
  }
  pSVar9 = propertySym->m_stackSym;
  pVVar8 = FindValue(this,&pSVar9->super_Sym);
  if (pVVar8 != (Value *)0x0) goto LAB_004938d5;
  pIVar2 = (pSVar9->field_5).m_instrDef;
  if ((pIVar2 != (Instr *)0x0 & pSVar9->field_0x18) != 1) {
    return (Value *)0x0;
  }
  OVar1 = pIVar2->m_opcode;
  if (((OVar1 != Ld_A) && (OVar1 != LdSlotArr)) && (OVar1 != LdSlot)) {
    return (Value *)0x0;
  }
  this_00 = pIVar2->m_src1;
  if (this_00 == (Opnd *)0x0) {
    return (Value *)0x0;
  }
  OVar6 = IR::Opnd::GetKind(this_00);
  if (OVar6 == OpndKindReg) {
    pRVar11 = IR::Opnd::AsRegOpnd(this_00);
    pSVar9 = pRVar11->m_sym;
LAB_0049397a:
    pVVar8 = FindValue(this,&pSVar9->super_Sym);
  }
  else {
    OVar6 = IR::Opnd::GetKind(this_00);
    if (OVar6 != OpndKindSym) {
      return (Value *)0x0;
    }
    pSVar12 = IR::Opnd::AsSymOpnd(this_00);
    pSVar9 = (StackSym *)pSVar12->m_sym;
    if ((pSVar9->super_Sym).m_kind == SymKindStack) goto LAB_0049397a;
    pFVar3 = this->globOpt->func;
    if (pFVar3->m_isBackgroundJIT == false) {
      scriptContext = (ScriptContext *)pFVar3->m_scriptContextInfo;
      ThreadContext::ProbeStackNoDispose
                (scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
    }
    pPVar10 = Sym::AsPropertySym((Sym *)pSVar9);
    pVVar8 = FindFuturePropertyValue(this,pPVar10);
  }
  if (pVVar8 == (Value *)0x0) {
    return (Value *)0x0;
  }
LAB_004938d5:
  pSVar9 = GetCopyPropSym(this,(Sym *)0x0,pVVar8);
  if (pSVar9 == (StackSym *)0x0) {
    return (Value *)0x0;
  }
  pPVar10 = PropertySym::Find((pSVar9->super_Sym).m_id,propertySym->m_propertyId,this->globOpt->func
                             );
  if (pPVar10 == (PropertySym *)0x0) {
    return (Value *)0x0;
  }
  pVVar8 = FindValue(this,&pPVar10->super_Sym);
  return pVVar8;
}

Assistant:

Value *
GlobOptBlockData::FindFuturePropertyValue(PropertySym *const propertySym)
{
    Assert(propertySym);

    // Try a direct lookup based on this sym
    Value *const value = this->FindValue(propertySym);
    if(value)
    {
        return value;
    }

    if(PHASE_OFF(Js::CopyPropPhase, this->globOpt->func))
    {
        // Need to use copy-prop info to backtrack
        return nullptr;
    }

    // Try to get the property object's value
    StackSym *const objectSym = propertySym->m_stackSym;
    Value *objectValue = this->FindValue(objectSym);
    if(!objectValue)
    {
        if(!objectSym->IsSingleDef())
        {
            return nullptr;
        }

        switch(objectSym->m_instrDef->m_opcode)
        {
        case Js::OpCode::Ld_A:
        case Js::OpCode::LdSlotArr:
        case Js::OpCode::LdSlot:
            // Allow only these op-codes for tracking the object sym's value transfer backwards. Other transfer op-codes
            // could be included here if this function is used in scenarios that need them.
            break;

        default:
            return nullptr;
        }

        // Try to get the property object's value from the src of the definition
        IR::Opnd *const objectTransferSrc = objectSym->m_instrDef->GetSrc1();
        if(!objectTransferSrc)
        {
            return nullptr;
        }
        if(objectTransferSrc->IsRegOpnd())
        {
            objectValue = this->FindValue(objectTransferSrc->AsRegOpnd()->m_sym);
        }
        else if(objectTransferSrc->IsSymOpnd())
        {
            Sym *const objectTransferSrcSym = objectTransferSrc->AsSymOpnd()->m_sym;
            if(objectTransferSrcSym->IsStackSym())
            {
                objectValue = this->FindValue(objectTransferSrcSym);
            }
            else
            {
                // About to make a recursive call, so when jitting in the foreground, probe the stack
                if(!this->globOpt->func->IsBackgroundJIT())
                {
                    PROBE_STACK_NO_DISPOSE(this->globOpt->func->GetScriptContext(), Js::Constants::MinStackDefault);
                }
                objectValue = FindFuturePropertyValue(objectTransferSrcSym->AsPropertySym());
            }
        }
        else
        {
            return nullptr;
        }
        if(!objectValue)
        {
            return nullptr;
        }
    }

    // Try to use the property object's copy-prop sym and the property ID to find a mapped property sym, and get its value
    StackSym *const objectCopyPropSym = this->GetCopyPropSym(nullptr, objectValue);
    if(!objectCopyPropSym)
    {
        return nullptr;
    }
    PropertySym *const propertyCopyPropSym = PropertySym::Find(objectCopyPropSym->m_id, propertySym->m_propertyId, this->globOpt->func);
    if(!propertyCopyPropSym)
    {
        return nullptr;
    }
    return this->FindValue(propertyCopyPropSym);
}